

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::LayerNormalizationLayerParams::LayerNormalizationLayerParams
          (LayerNormalizationLayerParams *this,LayerNormalizationLayerParams *from)

{
  void *pvVar1;
  WeightParams *pWVar2;
  WeightParams *pWVar3;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__LayerNormalizationLayerParams_0076c7a8;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  google::protobuf::RepeatedField<long>::RepeatedField
            (&this->normalizedshape_,&from->normalizedshape_);
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  pWVar2 = from->gamma_;
  if (pWVar2 == (WeightParams *)0x0 ||
      from == (LayerNormalizationLayerParams *)&_LayerNormalizationLayerParams_default_instance_) {
    pWVar3 = (WeightParams *)0x0;
  }
  else {
    pWVar3 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar3,pWVar2);
  }
  this->gamma_ = pWVar3;
  pWVar2 = from->beta_;
  if (pWVar2 == (WeightParams *)0x0 ||
      from == (LayerNormalizationLayerParams *)&_LayerNormalizationLayerParams_default_instance_) {
    pWVar3 = (WeightParams *)0x0;
  }
  else {
    pWVar3 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar3,pWVar2);
  }
  this->beta_ = pWVar3;
  this->eps_ = from->eps_;
  return;
}

Assistant:

LayerNormalizationLayerParams::LayerNormalizationLayerParams(const LayerNormalizationLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      normalizedshape_(from.normalizedshape_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_gamma()) {
    gamma_ = new ::CoreML::Specification::WeightParams(*from.gamma_);
  } else {
    gamma_ = NULL;
  }
  if (from.has_beta()) {
    beta_ = new ::CoreML::Specification::WeightParams(*from.beta_);
  } else {
    beta_ = NULL;
  }
  eps_ = from.eps_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.LayerNormalizationLayerParams)
}